

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

optional<pbrt::SquareMatrix<4>_> *
pbrt::Inverse<4>(optional<pbrt::SquareMatrix<4>_> *__return_storage_ptr__,SquareMatrix<4> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Float FVar4;
  float fVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  float fVar10;
  Float FVar11;
  float terms;
  float terms_5;
  float terms_4;
  float terms_6;
  float terms_3;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar22;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar23;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar24;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar25;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar26;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar27;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar28;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar29;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar30;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar31;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar32;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar33;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar34;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar35;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar36;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined1 auVar37 [32];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 extraout_var [60];
  float terms_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float terms_8;
  undefined1 local_128 [16];
  undefined1 local_58 [64];
  
  fVar1 = m->m[1][0];
  fVar2 = m->m[0][1];
  fVar3 = m->m[1][1];
  FVar4 = m->m[0][0];
  fVar5 = m->m[1][2];
  FVar6 = m->m[1][3];
  FVar7 = m->m[2][2];
  FVar8 = m->m[3][2];
  FVar9 = m->m[2][3];
  auVar19 = ZEXT416((uint)(fVar1 * fVar2));
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)FVar4),auVar19);
  auVar17 = ZEXT416((uint)fVar1);
  auVar38 = ZEXT416((uint)fVar2);
  auVar19 = vfnmadd231ss_fma(auVar19,auVar17,auVar38);
  terms = auVar18._0_4_ + auVar19._0_4_;
  fVar2 = m->m[0][2];
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)FVar4),ZEXT416((uint)(fVar1 * fVar2))
                           );
  auVar39 = ZEXT416((uint)fVar2);
  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),auVar17,auVar39);
  terms_5 = auVar18._0_4_ + auVar19._0_4_;
  fVar10 = m->m[0][3];
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)FVar4),ZEXT416((uint)FVar6),
                            ZEXT416((uint)(fVar1 * fVar10)));
  auVar40 = ZEXT416((uint)fVar10);
  auVar19 = vfnmadd213ss_fma(auVar17,auVar40,ZEXT416((uint)(fVar1 * fVar10)));
  terms_4 = auVar18._0_4_ + auVar19._0_4_;
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar38,ZEXT416((uint)(fVar3 * fVar2)));
  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar2)),ZEXT416((uint)fVar3),auVar39);
  terms_6 = auVar18._0_4_ + auVar19._0_4_;
  fVar1 = m->m[3][0];
  auVar18 = vfmsub213ss_fma(auVar38,ZEXT416((uint)FVar6),ZEXT416((uint)(fVar3 * fVar10)));
  auVar17 = vfnmadd213ss_fma(ZEXT416((uint)fVar3),auVar40,ZEXT416((uint)(fVar3 * fVar10)));
  auVar19 = vfmsub213ss_fma(ZEXT416((uint)FVar6),auVar39,ZEXT416((uint)(fVar5 * fVar10)));
  auVar38 = vfnmadd213ss_fma(auVar40,ZEXT416((uint)fVar5),ZEXT416((uint)(fVar5 * fVar10)));
  FVar4 = m->m[3][1];
  fVar3 = auVar17._0_4_ + auVar18._0_4_;
  fVar2 = m->m[2][1];
  FVar6 = m->m[2][0];
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)FVar7));
  auVar18 = vaddss_avx512f(auVar19,auVar38);
  FVar11 = m->m[3][3];
  terms_8 = auVar18._0_4_;
  auVar19 = ZEXT416((uint)(fVar1 * fVar2));
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)FVar4),ZEXT416((uint)FVar6),auVar19);
  auVar39 = ZEXT416((uint)fVar2);
  auVar19 = vfnmadd231ss_fma(auVar19,ZEXT416((uint)fVar1),auVar39);
  fVar2 = auVar18._0_4_ + auVar19._0_4_;
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)FVar8),ZEXT416((uint)FVar6),auVar17);
  auVar38 = ZEXT416((uint)fVar1);
  auVar19 = vfnmadd231ss_avx512f(auVar17,auVar38,ZEXT416((uint)FVar7));
  fVar1 = auVar19._0_4_ + auVar18._0_4_;
  auVar19 = vmulss_avx512f(auVar38,ZEXT416((uint)FVar9));
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)FVar6),ZEXT416((uint)FVar11),auVar19);
  auVar19 = vfnmadd213ss_avx512f(auVar38,ZEXT416((uint)FVar9),auVar19);
  auVar40 = ZEXT416((uint)FVar7);
  auVar17 = vmulss_avx512f(ZEXT416((uint)FVar4),auVar40);
  fVar5 = auVar18._0_4_ + auVar19._0_4_;
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)FVar8),auVar39,auVar17);
  auVar38 = ZEXT416((uint)FVar4);
  auVar19 = vfnmadd231ss_avx512f(auVar17,auVar38,auVar40);
  fVar10 = auVar19._0_4_ + auVar18._0_4_;
  auVar17 = ZEXT416((uint)FVar9);
  auVar19 = vmulss_avx512f(auVar38,auVar17);
  auVar18 = vfmsub213ss_fma(auVar39,ZEXT416((uint)FVar11),auVar19);
  auVar19 = vfnmadd213ss_avx512f(auVar38,auVar17,auVar19);
  terms_3 = auVar18._0_4_ + auVar19._0_4_;
  auVar18 = vmulss_avx512f(ZEXT416((uint)FVar8),auVar17);
  auVar19 = vfmsub213ss_avx512f(ZEXT416((uint)FVar11),auVar40,auVar18);
  auVar18 = vfnmadd213ss_avx512f(auVar17,ZEXT416((uint)FVar8),auVar18);
  auVar18 = vaddss_avx512f(auVar19,auVar18);
  terms_1 = auVar18._0_4_;
  eVar22 = InnerProduct<float,float,float,float,float,float,float,float,float,float,float,float>
                     (terms,terms_1,-terms_5,terms_3,terms_4,fVar10,terms_6,fVar5,terms_8,fVar2,
                      -fVar3,fVar1);
  if ((eVar22 != 0.0) || (NAN(eVar22))) {
    eVar23 = InnerProduct<float,float,float,float,float,float>
                       (m->m[1][1],terms_1,m->m[1][3],fVar10,-m->m[1][2],terms_3);
    eVar24 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[0][1],terms_1,m->m[0][2],terms_3,-m->m[0][3],fVar10);
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[3][2]),auVar18);
    eVar25 = InnerProduct<float,float,float,float,float,float>
                       (m->m[3][1],terms_8,m->m[3][3],terms_6,auVar18._0_4_,fVar3);
    eVar26 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[2][1],terms_8,m->m[2][2],fVar3,-m->m[2][3],terms_6);
    eVar27 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[1][0],terms_1,m->m[1][2],fVar5,-m->m[1][3],fVar1);
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[0][2]),auVar19);
    eVar28 = InnerProduct<float,float,float,float,float,float>
                       (m->m[0][0],terms_1,m->m[0][3],fVar1,auVar18._0_4_,fVar5);
    eVar29 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[3][0],terms_8,m->m[3][2],terms_4,-m->m[3][3],terms_5);
    auVar17._8_4_ = 0x80000000;
    auVar17._0_8_ = 0x8000000080000000;
    auVar17._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[2][2]),auVar17);
    eVar30 = InnerProduct<float,float,float,float,float,float>
                       (m->m[2][0],terms_8,m->m[2][3],terms_5,auVar18._0_4_,terms_4);
    auVar38._8_4_ = 0x80000000;
    auVar38._0_8_ = 0x8000000080000000;
    auVar38._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[1][1]),auVar38);
    eVar31 = InnerProduct<float,float,float,float,float,float>
                       (m->m[1][0],terms_3,m->m[1][3],fVar2,auVar18._0_4_,fVar5);
    eVar32 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[0][0],terms_3,m->m[0][1],fVar5,-m->m[0][3],fVar2);
    auVar39._8_4_ = 0x80000000;
    auVar39._0_8_ = 0x8000000080000000;
    auVar39._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[3][1]),auVar39);
    eVar33 = InnerProduct<float,float,float,float,float,float>
                       (m->m[3][0],fVar3,m->m[3][3],terms,auVar18._0_4_,terms_4);
    eVar34 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[2][0],fVar3,m->m[2][1],terms_4,-m->m[2][3],terms);
    local_128._0_4_ =
         InnerProduct<float,float,float,float,float,float>
                   (-m->m[1][0],fVar10,m->m[1][1],fVar1,-m->m[1][2],fVar2);
    local_128._4_4_ = extraout_XMM0_Db_02;
    local_128._8_4_ = extraout_XMM0_Dc_02;
    local_128._12_4_ = extraout_XMM0_Dd_02;
    auVar40._8_4_ = 0x80000000;
    auVar40._0_8_ = 0x8000000080000000;
    auVar40._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[0][1]),auVar40);
    eVar35 = InnerProduct<float,float,float,float,float,float>
                       (m->m[0][0],fVar10,m->m[0][2],fVar2,auVar18._0_4_,fVar1);
    eVar36 = InnerProduct<float,float,float,float,float,float>
                       (-m->m[3][0],terms_6,m->m[3][1],terms_5,-m->m[3][2],terms);
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(ZEXT416((uint)m->m[2][1]),auVar12);
    auVar21._0_4_ =
         InnerProduct<float,float,float,float,float,float>
                   (m->m[2][0],terms_6,m->m[2][2],terms,auVar18._0_4_,terms_5);
    auVar21._4_60_ = extraout_var;
    auVar15._4_4_ = extraout_XMM0_Db;
    auVar15._0_4_ = eVar23;
    auVar15._8_4_ = extraout_XMM0_Dc;
    auVar15._12_4_ = extraout_XMM0_Dd;
    auVar14._4_4_ = extraout_XMM0_Db_00;
    auVar14._0_4_ = eVar27;
    auVar14._8_4_ = extraout_XMM0_Dc_00;
    auVar14._12_4_ = extraout_XMM0_Dd_00;
    auVar20 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / eVar22)));
    auVar18 = vinsertps_avx(auVar15,ZEXT416((uint)eVar24),0x10);
    auVar19 = vinsertps_avx(auVar14,ZEXT416((uint)eVar28),0x10);
    auVar17 = vinsertps_avx(local_128,ZEXT416((uint)eVar35),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)eVar25),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)eVar29),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)eVar36),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)eVar26),0x30);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)eVar30),0x30);
    auVar17 = vinsertps_avx(auVar17,auVar21._0_16_,0x30);
    auVar13._4_4_ = extraout_XMM0_Db_01;
    auVar13._0_4_ = eVar31;
    auVar13._8_4_ = extraout_XMM0_Dc_01;
    auVar13._12_4_ = extraout_XMM0_Dd_01;
    auVar38 = vinsertps_avx(auVar13,ZEXT416((uint)eVar32),0x10);
    auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)eVar33),0x20);
    auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)eVar34),0x30);
    auVar37._16_16_ = auVar17;
    auVar37._0_16_ = auVar38;
    auVar21 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar19,auVar18)),auVar37,1);
    local_58 = vmulps_avx512f(auVar20,auVar21);
    SquareMatrix<4>::SquareMatrix((SquareMatrix<4> *)__return_storage_ptr__,(Float (*) [4])local_58)
    ;
    bVar16 = true;
  }
  else {
    *(undefined4 *)&__return_storage_ptr__->set = 0;
    bVar16 = false;
    __return_storage_ptr__->optionalValue =
         (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
         ZEXT1264(ZEXT812(0));
  }
  __return_storage_ptr__->set = bVar16;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<SquareMatrix<4>> Inverse(const SquareMatrix<4> &m) {
    // Via: https://github.com/google/ion/blob/master/ion/math/matrixutils.cc,
    // (c) Google, Apache license.

    // For 4x4 do not compute the adjugate as the transpose of the cofactor
    // matrix, because this results in extra work. Several calculations can be
    // shared across the sub-determinants.
    //
    // This approach is explained in David Eberly's Geometric Tools book,
    // excerpted here:
    //   http://www.geometrictools.com/Documentation/LaplaceExpansionTheorem.pdf
    Float s0 = DifferenceOfProducts(m[0][0], m[1][1], m[1][0], m[0][1]);
    Float s1 = DifferenceOfProducts(m[0][0], m[1][2], m[1][0], m[0][2]);
    Float s2 = DifferenceOfProducts(m[0][0], m[1][3], m[1][0], m[0][3]);

    Float s3 = DifferenceOfProducts(m[0][1], m[1][2], m[1][1], m[0][2]);
    Float s4 = DifferenceOfProducts(m[0][1], m[1][3], m[1][1], m[0][3]);
    Float s5 = DifferenceOfProducts(m[0][2], m[1][3], m[1][2], m[0][3]);

    Float c0 = DifferenceOfProducts(m[2][0], m[3][1], m[3][0], m[2][1]);
    Float c1 = DifferenceOfProducts(m[2][0], m[3][2], m[3][0], m[2][2]);
    Float c2 = DifferenceOfProducts(m[2][0], m[3][3], m[3][0], m[2][3]);

    Float c3 = DifferenceOfProducts(m[2][1], m[3][2], m[3][1], m[2][2]);
    Float c4 = DifferenceOfProducts(m[2][1], m[3][3], m[3][1], m[2][3]);
    Float c5 = DifferenceOfProducts(m[2][2], m[3][3], m[3][2], m[2][3]);

    Float determinant = InnerProduct(s0, c5, -s1, c4, s2, c3, s3, c2, s5, c0, -s4, c1);
    if (determinant == 0)
        return {};
    Float s = 1 / determinant;

    Float inv[4][4] = {s * InnerProduct(m[1][1], c5, m[1][3], c3, -m[1][2], c4),
                       s * InnerProduct(-m[0][1], c5, m[0][2], c4, -m[0][3], c3),
                       s * InnerProduct(m[3][1], s5, m[3][3], s3, -m[3][2], s4),
                       s * InnerProduct(-m[2][1], s5, m[2][2], s4, -m[2][3], s3),

                       s * InnerProduct(-m[1][0], c5, m[1][2], c2, -m[1][3], c1),
                       s * InnerProduct(m[0][0], c5, m[0][3], c1, -m[0][2], c2),
                       s * InnerProduct(-m[3][0], s5, m[3][2], s2, -m[3][3], s1),
                       s * InnerProduct(m[2][0], s5, m[2][3], s1, -m[2][2], s2),

                       s * InnerProduct(m[1][0], c4, m[1][3], c0, -m[1][1], c2),
                       s * InnerProduct(-m[0][0], c4, m[0][1], c2, -m[0][3], c0),
                       s * InnerProduct(m[3][0], s4, m[3][3], s0, -m[3][1], s2),
                       s * InnerProduct(-m[2][0], s4, m[2][1], s2, -m[2][3], s0),

                       s * InnerProduct(-m[1][0], c3, m[1][1], c1, -m[1][2], c0),
                       s * InnerProduct(m[0][0], c3, m[0][2], c0, -m[0][1], c1),
                       s * InnerProduct(-m[3][0], s3, m[3][1], s1, -m[3][2], s0),
                       s * InnerProduct(m[2][0], s3, m[2][2], s0, -m[2][1], s1)};

    return SquareMatrix<4>(inv);
}